

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.h
# Opt level: O2

void __thiscall
r_exec::MDLController::reduce_cache<r_exec::SecondaryMDLController>
          (MDLController *this,Fact *f_p_f_imdl,MDLController *controller)

{
  BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController> *this_00;
  _Mem *this_01;
  
  this_00 = (BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController>
             *)operator_new(0x30);
  BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController>::
  BatchReductionJob(this_00,(SecondaryMDLController *)this,f_p_f_imdl,controller);
  this_01 = (_Mem *)r_code::Mem::Get();
  _Mem::pushReductionJob(this_01,(_ReductionJob *)this_00);
  return;
}

Assistant:

void reduce_cache(Fact *f_p_f_imdl, MDLController *controller)   // fwd; controller is the controller of the requirement which produced f_p_f_imdl.
    {
        BatchReductionJob<C, Fact, MDLController> *j = new BatchReductionJob<C, Fact, MDLController>((C *)this, f_p_f_imdl, controller);
        _Mem::Get()->pushReductionJob(j);
    }